

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O1

int crl_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  byte *pbVar1;
  X509_CRL *data;
  ASN1_INTEGER *a;
  DIST_POINT_NAME *dpn;
  OPENSSL_STACK *sk;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  EVP_MD *type;
  ISSUING_DIST_POINT *pIVar6;
  X509_NAME *iname;
  AUTHORITY_KEYID *pAVar7;
  size_t sVar8;
  X509_EXTENSION *pXVar9;
  ASN1_OBJECT *o;
  size_t sVar10;
  OPENSSL_STACK *pOVar11;
  X509_REVOKED *x;
  ASN1_ENUMERATED *a_00;
  long lVar12;
  size_t sVar13;
  byte bVar14;
  int iVar15;
  bool bVar16;
  int i;
  undefined8 local_38;
  
  data = (X509_CRL *)*pval;
  if (operation == 5) {
    a = data->crl->version;
    local_38 = in_RAX;
    if (a == (ASN1_INTEGER *)0x0) {
      uVar5 = 0;
LAB_001a4bf3:
      if ((uVar5 != 0) || (data->crl->extensions == (stack_st_X509_EXTENSION *)0x0)) {
        type = EVP_sha256();
        iVar2 = X509_CRL_digest(data,type,(uchar *)&data->idp_reasons,(uint *)0x0);
        if (iVar2 == 0) {
          return 0;
        }
        pIVar6 = (ISSUING_DIST_POINT *)X509_CRL_get_ext_d2i(data,0x302,(int *)&local_38,(int *)0x0);
        data->idp = pIVar6;
        if (pIVar6 == (ISSUING_DIST_POINT *)0x0) {
          if ((int)local_38 != -1) {
            return 0;
          }
        }
        else {
          uVar4 = data->idp_flags;
          data->idp_flags = uVar4 | 1;
          bVar14 = 0 < pIVar6->onlyuser;
          if ((bool)bVar14) {
            data->idp_flags = uVar4 | 5;
          }
          if (0 < pIVar6->onlyCA) {
            bVar14 = bVar14 + 1;
            *(byte *)&data->idp_flags = (byte)data->idp_flags | 8;
          }
          if (0 < pIVar6->onlyattr) {
            bVar14 = bVar14 + 1;
            *(byte *)&data->idp_flags = (byte)data->idp_flags | 0x10;
          }
          if (1 < bVar14) {
            *(byte *)&data->idp_flags = (byte)data->idp_flags | 2;
          }
          if (0 < pIVar6->indirectCRL) {
            *(byte *)&data->idp_flags = (byte)data->idp_flags | 0x20;
          }
          if (pIVar6->onlysomereasons != (ASN1_BIT_STRING *)0x0) {
            *(byte *)&data->idp_flags = (byte)data->idp_flags | 0x40;
          }
          dpn = pIVar6->distpoint;
          iname = X509_CRL_get_issuer((X509_CRL *)data);
          iVar2 = DIST_POINT_set_dpname(dpn,(X509_NAME *)iname);
          if (iVar2 == 0) {
            return 0;
          }
        }
        pAVar7 = (AUTHORITY_KEYID *)X509_CRL_get_ext_d2i(data,0x5a,(int *)&local_38,(int *)0x0);
        data->akid = pAVar7;
        if ((pAVar7 == (AUTHORITY_KEYID *)0x0) && ((int)local_38 != -1)) {
          return 0;
        }
        pOVar11 = (OPENSSL_STACK *)data->crl->extensions;
        sVar8 = OPENSSL_sk_num(pOVar11);
        if (sVar8 != 0) {
          sVar8 = 0;
          do {
            pXVar9 = (X509_EXTENSION *)OPENSSL_sk_value(pOVar11,sVar8);
            o = X509_EXTENSION_get_object(pXVar9);
            iVar2 = OBJ_obj2nid(o);
            iVar3 = X509_EXTENSION_get_critical(pXVar9);
            iVar15 = 0;
            if (((iVar3 != 0) && (iVar15 = 5, iVar2 != 0x5a)) && (iVar2 != 0x302)) {
              pbVar1 = (byte *)((long)&data->flags + 1);
              *pbVar1 = *pbVar1 | 2;
              iVar15 = 3;
            }
            if ((iVar15 != 5) && (iVar15 != 0)) break;
            sVar8 = sVar8 + 1;
            sVar10 = OPENSSL_sk_num(pOVar11);
          } while (sVar8 < sVar10);
        }
        pOVar11 = (OPENSSL_STACK *)X509_CRL_get_REVOKED((X509_CRL *)data);
        sVar8 = OPENSSL_sk_num(pOVar11);
        if (sVar8 != 0) {
          sVar8 = 0;
          do {
            x = (X509_REVOKED *)OPENSSL_sk_value(pOVar11,sVar8);
            a_00 = (ASN1_ENUMERATED *)
                   X509_REVOKED_get_ext_d2i(x,0x8d,(int *)((long)&local_38 + 4),(int *)0x0);
            bVar16 = local_38._4_4_ != -1;
            uVar4 = 0x80;
            if (bVar16 && a_00 == (ASN1_ENUMERATED *)0x0) {
LAB_001a4e18:
              data->flags = data->flags | uVar4;
            }
            else {
              if (a_00 == (ASN1_ENUMERATED *)0x0) {
                *(undefined4 *)&x->issuer = 0xffffffff;
              }
              else {
                lVar12 = ASN1_ENUMERATED_get(a_00);
                *(int *)&x->issuer = (int)lVar12;
                ASN1_ENUMERATED_free(a_00);
              }
              sk = (OPENSSL_STACK *)x->extensions;
              sVar10 = OPENSSL_sk_num(sk);
              if (sVar10 != 0) {
                sVar10 = 0;
                do {
                  pXVar9 = (X509_EXTENSION *)OPENSSL_sk_value(sk,sVar10);
                  iVar2 = X509_EXTENSION_get_critical(pXVar9);
                  if (iVar2 != 0) {
                    uVar4 = 0x200;
                    goto LAB_001a4e18;
                  }
                  sVar10 = sVar10 + 1;
                  sVar13 = OPENSSL_sk_num(sk);
                } while (sVar10 < sVar13);
              }
            }
            if (bVar16 && a_00 == (ASN1_ENUMERATED *)0x0) break;
            sVar8 = sVar8 + 1;
            sVar10 = OPENSSL_sk_num(pOVar11);
          } while (sVar8 < sVar10);
        }
        goto LAB_001a4ba2;
      }
      iVar2 = 0x8b;
      iVar3 = 0x8d;
    }
    else {
      uVar5 = ASN1_INTEGER_get(a);
      if (uVar5 < 2) goto LAB_001a4bf3;
      iVar2 = 0x8c;
      iVar3 = 0x86;
    }
    iVar15 = 0;
    ERR_put_error(0xb,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                  ,iVar3);
  }
  else {
    if (operation == 3) {
      AUTHORITY_KEYID_free(data->akid);
      ISSUING_DIST_POINT_free(data->idp);
    }
    else if (operation == 1) {
      *(undefined8 *)&data->flags = 0;
      *(undefined8 *)((long)&data->akid + 4) = 0;
      *(undefined8 *)((long)&data->idp + 4) = 0;
    }
LAB_001a4ba2:
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

static int crl_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                  void *exarg) {
  X509_CRL *crl = (X509_CRL *)*pval;
  int i;

  switch (operation) {
    case ASN1_OP_NEW_POST:
      crl->idp = NULL;
      crl->akid = NULL;
      crl->flags = 0;
      crl->idp_flags = 0;
      break;

    case ASN1_OP_D2I_POST: {
      // The version must be one of v1(0) or v2(1).
      long version = X509_CRL_VERSION_1;
      if (crl->crl->version != NULL) {
        version = ASN1_INTEGER_get(crl->crl->version);
        // TODO(https://crbug.com/boringssl/364): |X509_CRL_VERSION_1|
        // should also be rejected. This means an explicitly-encoded X.509v1
        // version. v1 is DEFAULT, so DER requires it be omitted.
        if (version < X509_CRL_VERSION_1 || version > X509_CRL_VERSION_2) {
          OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
          return 0;
        }
      }

      // Per RFC 5280, section 5.1.2.1, extensions require v2.
      if (version != X509_CRL_VERSION_2 && crl->crl->extensions != NULL) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
        return 0;
      }

      if (!X509_CRL_digest(crl, EVP_sha256(), crl->crl_hash, NULL)) {
        return 0;
      }

      crl->idp = reinterpret_cast<ISSUING_DIST_POINT *>(
          X509_CRL_get_ext_d2i(crl, NID_issuing_distribution_point, &i, NULL));
      if (crl->idp != NULL) {
        if (!setup_idp(crl, crl->idp)) {
          return 0;
        }
      } else if (i != -1) {
        return 0;
      }

      crl->akid = reinterpret_cast<AUTHORITY_KEYID *>(
          X509_CRL_get_ext_d2i(crl, NID_authority_key_identifier, &i, NULL));
      if (crl->akid == NULL && i != -1) {
        return 0;
      }

      // See if we have any unhandled critical CRL extensions and indicate
      // this in a flag. We only currently handle IDP so anything else
      // critical sets the flag. This code accesses the X509_CRL structure
      // directly: applications shouldn't do this.
      const STACK_OF(X509_EXTENSION) *exts = crl->crl->extensions;
      for (size_t idx = 0; idx < sk_X509_EXTENSION_num(exts); idx++) {
        const X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, idx);
        int nid = OBJ_obj2nid(X509_EXTENSION_get_object(ext));
        if (X509_EXTENSION_get_critical(ext)) {
          if (nid == NID_issuing_distribution_point ||
              nid == NID_authority_key_identifier) {
            continue;
          }
          crl->flags |= EXFLAG_CRITICAL;
          break;
        }
      }

      if (!crl_parse_entry_extensions(crl)) {
        return 0;
      }

      break;
    }

    case ASN1_OP_FREE_POST:
      AUTHORITY_KEYID_free(crl->akid);
      ISSUING_DIST_POINT_free(crl->idp);
      break;
  }
  return 1;
}